

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chargen.cpp
# Opt level: O2

int anon_unknown.dwarf_3b63::underline_count(int glyph,int begin,int end)

{
  int iVar1;
  long lVar2;
  
  iVar1 = pixel_count(glyph,begin,end);
  if (9 < end) {
    for (lVar2 = 0; lVar2 != 10; lVar2 = lVar2 + 1) {
      iVar1 = iVar1 + (uint)(*(char *)(*(long *)((anonymous_namespace)::glyphs +
                                                (long)glyph * 0x50 + 0x48) + lVar2) == '_');
    }
  }
  return iVar1;
}

Assistant:

int underline_count(int glyph, int begin, int end)
{
    int count = pixel_count(glyph, begin, end);
    if (begin < 9 && 9 < end)
    {
        for (int col = 0; col < 10; ++col)
        {
            if (glyphs[glyph][9][col] == '_')
                ++count;
        }
    }
    return count;
}